

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbeSorterExtendFile(sqlite3 *db,sqlite3_file *pFd,i64 nByte)

{
  long lVar1;
  long in_RDX;
  sqlite3_file *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int chunksize;
  void *p;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDX <= *(int *)(in_RDI + 0xb8)) && (2 < in_RSI->pMethods->iVersion)) {
    uVar2 = 0x1000;
    sqlite3OsFileControlHint(in_RSI,in_stack_ffffffffffffffcc,(void *)0x199dc9);
    sqlite3OsFileControlHint(in_RSI,in_stack_ffffffffffffffcc,(void *)0x199ddd);
    sqlite3OsFetch((sqlite3_file *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),in_RDI,
                   (int)((ulong)in_RSI >> 0x20),
                   (void **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void vdbeSorterExtendFile(sqlite3 *db, sqlite3_file *pFd, i64 nByte){
  if( nByte<=(i64)(db->nMaxSorterMmap) && pFd->pMethods->iVersion>=3 ){
    void *p = 0;
    int chunksize = 4*1024;
    sqlite3OsFileControlHint(pFd, SQLITE_FCNTL_CHUNK_SIZE, &chunksize);
    sqlite3OsFileControlHint(pFd, SQLITE_FCNTL_SIZE_HINT, &nByte);
    sqlite3OsFetch(pFd, 0, (int)nByte, &p);
    if( p ) sqlite3OsUnfetch(pFd, 0, p);
  }
}